

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

void __thiscall
r_exec::GMonitor::GMonitor
          (GMonitor *this,PMDLController *controller,BindingMap *bindings,uint64_t deadline,
          uint64_t sim_thz,Fact *goal,Fact *f_imdl,_Fact *predicted_evidence)

{
  atomic_int_fast64_t *paVar1;
  TimeJob *this_00;
  _Mem *this_01;
  
  _GMonitor::_GMonitor(&this->super__GMonitor,controller,bindings,deadline,sim_thz,goal,f_imdl);
  (this->super__GMonitor).super_Monitor.super__Object._vptr__Object =
       (_func_int **)&PTR___GMonitor_001bf938;
  this->predicted_evidence = predicted_evidence;
  this->injected_goal = predicted_evidence == (_Fact *)0x0;
  this_00 = (TimeJob *)operator_new(0x28);
  if ((this->super__GMonitor).simulating == 0) {
    sim_thz = deadline;
  }
  TimeJob::TimeJob(this_00,sim_thz);
  (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__MonitoringJob_001bfad0;
  this_00[1].super__Object._vptr__Object = (_func_int **)this;
  LOCK();
  paVar1 = &(this->super__GMonitor).super_Monitor.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  this_01 = (_Mem *)r_code::Mem::Get();
  _Mem::pushTimeJob(this_01,this_00);
  return;
}

Assistant:

GMonitor::GMonitor(PMDLController *controller,
                   BindingMap *bindings,
                   uint64_t deadline,
                   uint64_t sim_thz,
                   Fact *goal,
                   Fact *f_imdl,
                   _Fact *predicted_evidence): _GMonitor(controller,
                               bindings,
                               deadline,
                               sim_thz,
                               goal,
                               f_imdl),
    predicted_evidence(predicted_evidence)   // goal is f0->g->f1->object.
{
    injected_goal = (predicted_evidence == nullptr);
    MonitoringJob<GMonitor> *j = new MonitoringJob<GMonitor>(this, simulating ? sim_thz : deadline);
    _Mem::Get()->pushTimeJob(j);
}